

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mixed_negation.c
# Opt level: O2

int run_container_negation_range_inplace
              (run_container_t *src,int range_start,int range_end,container_t **dst)

{
  uint uVar1;
  ushort pos;
  run_container_t *prVar2;
  _Bool _Var3;
  _Bool _Var4;
  int iVar5;
  ulong uVar6;
  container_t *pcVar7;
  uint16_t uVar8;
  ulong uVar9;
  uint16_t length;
  ushort start;
  uint16_t uVar10;
  uint8_t return_typecode;
  run_container_t *local_40;
  container_t **local_38;
  
  if (range_start < range_end) {
    uVar8 = (uint16_t)range_end;
    pos = (ushort)range_start;
    local_40 = src;
    if (src->capacity == src->n_runs) {
      if (range_start < 1) {
        _Var3 = false;
      }
      else {
        _Var3 = run_container_contains(src,pos - 1);
      }
      _Var4 = run_container_contains(local_40,pos);
      if (_Var3 == _Var4) {
        _Var3 = run_container_contains(local_40,uVar8 - 1);
        _Var4 = false;
        if (range_end != 0x10000) {
          _Var4 = run_container_contains(local_40,uVar8);
        }
        prVar2 = local_40;
        if (_Var4 == _Var3) {
          iVar5 = run_container_negation_range(local_40,range_start,range_end,dst);
          run_container_free(prVar2);
          return iVar5;
        }
      }
    }
    uVar1 = local_40->n_runs;
    local_40->n_runs = 0;
    uVar6 = 0;
    uVar9 = 0;
    if (0 < (int)uVar1) {
      uVar9 = (ulong)uVar1;
    }
    while (uVar9 != uVar6) {
      start = local_40->runs[uVar6].value;
      if (range_start <= (int)(uint)start) {
        length = local_40->runs[uVar6].length;
        uVar9 = uVar6;
        goto LAB_0011890b;
      }
      uVar6 = uVar6 + 1;
      local_40->n_runs = (int32_t)uVar6;
    }
    start = 0;
    length = 0;
LAB_0011890b:
    local_38 = dst;
    run_container_smart_append_exclusive(local_40,pos,~pos + uVar8);
    uVar10 = 0;
    uVar8 = 0;
    for (; prVar2 = local_40, (long)uVar9 < (long)(int)uVar1; uVar9 = uVar9 + 1) {
      if ((int)uVar9 + 1 < (int)uVar1) {
        uVar8 = local_40->runs[uVar9 + 1].value;
        uVar10 = local_40->runs[uVar9 + 1].length;
      }
      run_container_smart_append_exclusive(local_40,start,length);
      start = uVar8;
      length = uVar10;
    }
    pcVar7 = convert_run_to_efficient_container(local_40,&return_typecode);
    *local_38 = pcVar7;
    if (return_typecode != '\x03') {
      run_container_free(prVar2);
      return (uint)return_typecode;
    }
  }
  else {
    *dst = src;
  }
  return 3;
}

Assistant:

int run_container_negation_range_inplace(run_container_t *src,
                                         const int range_start,
                                         const int range_end,
                                         container_t **dst) {
    uint8_t return_typecode;

    if (range_end <= range_start) {
        *dst = src;
        return RUN_CONTAINER_TYPE;
    }

    // TODO: efficient special case when range is 0 to 65535 inclusive

    if (src->capacity == src->n_runs) {
        // no excess room.  More checking to see if result can fit
        bool last_val_before_range = false;
        bool first_val_in_range = false;
        bool last_val_in_range = false;
        bool first_val_past_range = false;

        if (range_start > 0)
            last_val_before_range =
                run_container_contains(src, (uint16_t)(range_start - 1));
        first_val_in_range = run_container_contains(src, (uint16_t)range_start);

        if (last_val_before_range == first_val_in_range) {
            last_val_in_range =
                run_container_contains(src, (uint16_t)(range_end - 1));
            if (range_end != 0x10000)
                first_val_past_range =
                    run_container_contains(src, (uint16_t)range_end);

            if (last_val_in_range ==
                first_val_past_range) {  // no space for inplace
                int ans = run_container_negation_range(src, range_start,
                                                       range_end, dst);
                run_container_free(src);
                return ans;
            }
        }
    }
    // all other cases: result will fit

    run_container_t *ans = src;
    int my_nbr_runs = src->n_runs;

    ans->n_runs = 0;
    int k = 0;
    for (; (k < my_nbr_runs) && (src->runs[k].value < range_start); ++k) {
        // ans->runs[k] = src->runs[k]; (would be self-copy)
        ans->n_runs++;
    }

    // as with Java implementation, use locals to give self a buffer of depth 1
    rle16_t buffered = MAKE_RLE16(0, 0);
    rle16_t next = buffered;
    if (k < my_nbr_runs) buffered = src->runs[k];

    run_container_smart_append_exclusive(
        ans, (uint16_t)range_start, (uint16_t)(range_end - range_start - 1));

    for (; k < my_nbr_runs; ++k) {
        if (k + 1 < my_nbr_runs) next = src->runs[k + 1];

        run_container_smart_append_exclusive(ans, buffered.value,
                                             buffered.length);
        buffered = next;
    }

    *dst = convert_run_to_efficient_container(ans, &return_typecode);
    if (return_typecode != RUN_CONTAINER_TYPE) run_container_free(ans);

    return return_typecode;
}